

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

OPJ_BOOL opj_t2_init_seg(opj_tcd_cblk_dec_t *cblk,OPJ_UINT32 index,OPJ_UINT32 cblksty,
                        OPJ_UINT32 first)

{
  uint uVar1;
  opj_tcd_seg_t *poVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  OPJ_UINT32 l_m_current_max_segs;
  opj_tcd_seg_t *new_segs;
  OPJ_UINT32 l_nb_segs;
  opj_tcd_seg_t *seg;
  OPJ_UINT32 first_local;
  OPJ_UINT32 cblksty_local;
  OPJ_UINT32 index_local;
  opj_tcd_cblk_dec_t *cblk_local;
  
  if (cblk->m_current_max_segs < index + 1) {
    uVar1 = cblk->m_current_max_segs + 10;
    poVar2 = (opj_tcd_seg_t *)opj_realloc(cblk->segs,(ulong)uVar1 * 0x18);
    if (poVar2 == (opj_tcd_seg_t *)0x0) {
      return 0;
    }
    cblk->segs = poVar2;
    memset(poVar2 + cblk->m_current_max_segs,0,0xf0);
    cblk->m_current_max_segs = uVar1;
  }
  poVar2 = cblk->segs + index;
  opj_tcd_reinit_segment(poVar2);
  if ((cblksty & 4) == 0) {
    if ((cblksty & 1) == 0) {
      poVar2->maxpasses = 0x6d;
    }
    else if (first == 0) {
      bVar4 = true;
      if (poVar2[-1].maxpasses != 1) {
        bVar4 = poVar2[-1].maxpasses == 10;
      }
      OVar3 = 1;
      if (bVar4) {
        OVar3 = 2;
      }
      poVar2->maxpasses = OVar3;
    }
    else {
      poVar2->maxpasses = 10;
    }
  }
  else {
    poVar2->maxpasses = 1;
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_init_seg(opj_tcd_cblk_dec_t* cblk,
                                OPJ_UINT32 index,
                                OPJ_UINT32 cblksty,
                                OPJ_UINT32 first)
{
    opj_tcd_seg_t* seg = 00;
    OPJ_UINT32 l_nb_segs = index + 1;

    if (l_nb_segs > cblk->m_current_max_segs) {
        opj_tcd_seg_t* new_segs;
        OPJ_UINT32 l_m_current_max_segs = cblk->m_current_max_segs +
                                          OPJ_J2K_DEFAULT_NB_SEGS;

        new_segs = (opj_tcd_seg_t*) opj_realloc(cblk->segs,
                                                l_m_current_max_segs * sizeof(opj_tcd_seg_t));
        if (! new_segs) {
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to initialize segment %d\n", l_nb_segs); */
            return OPJ_FALSE;
        }
        cblk->segs = new_segs;
        memset(new_segs + cblk->m_current_max_segs,
               0, OPJ_J2K_DEFAULT_NB_SEGS * sizeof(opj_tcd_seg_t));
        cblk->m_current_max_segs = l_m_current_max_segs;
    }

    seg = &cblk->segs[index];
    opj_tcd_reinit_segment(seg);

    if (cblksty & J2K_CCP_CBLKSTY_TERMALL) {
        seg->maxpasses = 1;
    } else if (cblksty & J2K_CCP_CBLKSTY_LAZY) {
        if (first) {
            seg->maxpasses = 10;
        } else {
            seg->maxpasses = (((seg - 1)->maxpasses == 1) ||
                              ((seg - 1)->maxpasses == 10)) ? 2 : 1;
        }
    } else {
        /* See paragraph "B.10.6 Number of coding passes" of the standard.
         * Probably that 109 must be interpreted a (Mb-1)*3 + 1 with Mb=37,
         * Mb being the maximum number of bit-planes available for the
         * representation of coefficients in the sub-band */
        seg->maxpasses = 109;
    }

    return OPJ_TRUE;
}